

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase316::run(TestCase316 *this)

{
  anon_union_16_1_a8c68091_for_NullableValue<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_>_2
  *params_2;
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> result;
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> result_2;
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>_>
  parser;
  Input input;
  
  parser.rest.rest._2_1_ = 0;
  parser.rest.rest.first =
       (Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>
        )0x72;
  parser.first = (Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>
                  )0x62;
  parser.rest.first.subParser =
       (Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>
        )0x61;
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "bar";
  input.end = "";
  input.best = "bar";
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&result,&parser,&input);
  params_2 = &result.ptr.field_1;
  if (result.ptr.isSet == true) {
    if ((result.ptr.field_1.value.impl.super_TupleElement<0U,_unsigned_int>.value != 0x7b) &&
       (kj::_::Debug::minSeverity < 3)) {
      result_2.ptr.isSet = true;
      result_2.ptr._1_3_ = 0;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x147,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(*value))\", 123u, get<0>(*value)",
                 (char (*) [44])"failed: expected (123u) == (get<0>(*value))",(uint *)&result_2,
                 (uint *)params_2);
    }
    if (result.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr.
        isSet == true) {
      if ((result.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr.
           field_1 != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
        result_2.ptr.isSet = true;
        result_2.ptr._1_3_ = 1;
        kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x149,ERROR,"\"failed: expected \" \"(456u) == (*value2)\", 456u, *value2",
                   (char (*) [37])"failed: expected (456u) == (*value2)",(uint *)&result_2,
                   (uint *)((long)&result.ptr.field_1 + 8));
      }
    }
    else {
      result_2.ptr._0_4_ = result_2.ptr._0_4_ & 0xffffff00;
      result_2.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr =
           (TupleElement<1U,_kj::Maybe<unsigned_int>_>)anon_var_dwarf_1bf263;
      result_2.ptr.field_1.value.impl.super_TupleElement<2U,_unsigned_int>.value =
           (TupleElement<2U,_unsigned_int>)0x14b;
      AddFailureAdapter::operator<<
                ((AddFailureAdapter *)&result_2,(char (*) [24])"Expected 456, got null.");
      AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_2);
    }
    if ((result.ptr.field_1.value.impl.super_TupleElement<2U,_unsigned_int>.value != 0x315) &&
       (kj::_::Debug::minSeverity < 3)) {
      result_2.ptr.isSet = true;
      result_2.ptr._1_3_ = 3;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x14d,ERROR,
                 "\"failed: expected \" \"(789u) == (get<2>(*value))\", 789u, get<2>(*value)",
                 (char (*) [44])"failed: expected (789u) == (get<2>(*value))",(uint *)&result_2,
                 (uint *)((long)&result.ptr.field_1 + 0xc));
    }
  }
  else {
    result_2.ptr._0_4_ = result_2.ptr._0_4_ & 0xffffff00;
    result_2.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr =
         (TupleElement<1U,_kj::Maybe<unsigned_int>_>)anon_var_dwarf_1bf263;
    result_2.ptr.field_1.value.impl.super_TupleElement<2U,_unsigned_int>.value =
         (TupleElement<2U,_unsigned_int>)0x14f;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_2,(char (*) [33])"Expected result tuple, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_2);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x151,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "br";
  input.end = "";
  input.best = "br";
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&result,&parser,&input);
  if (result.ptr.isSet == true) {
    if (result.ptr.field_1.value.impl.super_TupleElement<0U,_unsigned_int>.value != 0x7b &&
        kj::_::Debug::minSeverity < 3) {
      result_2.ptr.isSet = true;
      result_2.ptr._1_3_ = 0;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(123u) == (get<0>(*value))\", 123u, get<0>(*value)",
                 (char (*) [44])"failed: expected (123u) == (get<0>(*value))",(uint *)&result_2,
                 (uint *)params_2);
    }
    if ((kj::_::Debug::minSeverity < 3 &
        result.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr.
        isSet) == 1) {
      kj::_::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x15a,ERROR,"\"failed: expected \" \"get<1>(*value) == nullptr\"",
                 (char (*) [43])"failed: expected get<1>(*value) == nullptr");
    }
    if ((result.ptr.field_1.value.impl.super_TupleElement<2U,_unsigned_int>.value != 0x315) &&
       (kj::_::Debug::minSeverity < 3)) {
      result_2.ptr.isSet = true;
      result_2.ptr._1_3_ = 3;
      kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(789u) == (get<2>(*value))\", 789u, get<2>(*value)",
                 (char (*) [44])"failed: expected (789u) == (get<2>(*value))",(uint *)&result_2,
                 (uint *)((long)&result.ptr.field_1 + 0xc));
    }
  }
  else {
    result_2.ptr._0_4_ = result_2.ptr._0_4_ & 0xffffff00;
    result_2.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr =
         (TupleElement<1U,_kj::Maybe<unsigned_int>_>)anon_var_dwarf_1bf263;
    result_2.ptr.field_1.value.impl.super_TupleElement<2U,_unsigned_int>.value =
         (TupleElement<2U,_unsigned_int>)0x15d;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_2,(char (*) [33])"Expected result tuple, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_2);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x15f,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "bzr";
  input.end = "";
  input.best = "bzr";
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&result_2,&parser,&input);
  if ((result_2.ptr.isSet == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x166,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return;
}

Assistant:

TEST(CommonParsers, OptionalParser) {
  auto parser = sequence(
      transform(exactly('b'), []() -> uint { return 123; }),
      optional(transform(exactly('a'), []() -> uint { return 456; })),
      transform(exactly('r'), []() -> uint { return 789; }));

  {
    StringPtr text = "bar";
    Input input(text.begin(), text.end());
    Maybe<Tuple<uint, Maybe<uint>, uint>> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ(123u, get<0>(*value));
      KJ_IF_MAYBE(value2, get<1>(*value)) {
        EXPECT_EQ(456u, *value2);
      } else {
        ADD_FAILURE() << "Expected 456, got null.";
      }
      EXPECT_EQ(789u, get<2>(*value));
    } else {
      ADD_FAILURE() << "Expected result tuple, got null.";
    }